

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

base_learner * Search::setup(options_i *options,vw *all)

{
  uint uVar1;
  options_i *poVar2;
  options_i *this;
  undefined *puVar3;
  search_task *psVar4;
  search_metatask *psVar5;
  ulong __val;
  _func_void_search_ptr_size_t_ptr_options_i_ptr *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 *puVar12;
  vw *pvVar13;
  char cVar14;
  char cVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  search *sch;
  search_private *psVar19;
  undefined8 **ppuVar20;
  typed_option<unsigned_long> *ptVar21;
  typed_option<float> *ptVar22;
  vw_exception *pvVar23;
  polylabel *ppVar24;
  undefined **ppuVar25;
  typed_option<unsigned_int> *ptVar26;
  base_learner *base;
  clock_t cVar27;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar28;
  ostream *poVar29;
  ulong uVar30;
  long lVar31;
  RollMethod RVar32;
  label_parser *plVar33;
  byte bVar34;
  byte bVar35;
  float fVar36;
  size_type __dnew_3;
  size_type __dnew;
  stringstream __msg;
  option_group_definition new_options;
  string rollout_string;
  string rollin_string;
  string task_string;
  size_type __dnew_40;
  string interpolation_string;
  string metatask_string;
  uint32_t search_trained_nb_policies;
  string search_allowed_transitions;
  string neighbor_features_string;
  undefined8 **local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined2 local_720;
  undefined8 *local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined2 local_700;
  options_i *local_6f8;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  string local_6c0 [64];
  bool local_680;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_668;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_658;
  size_t *local_568;
  uint32_t *local_560;
  option_group_definition local_558;
  vw *local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  size_t *local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  pointer local_4b0;
  uint local_4a8;
  char local_4a0 [16];
  float *local_490;
  float *local_488;
  float *local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  uint local_434;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  undefined4 *local_3f0;
  undefined8 local_3e8;
  undefined4 local_3e0;
  undefined3 uStack_3dc;
  undefined1 local_3d9;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  undefined2 *local_210;
  undefined8 local_208;
  undefined2 local_200;
  undefined1 local_1fe;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  undefined6 *local_f0;
  undefined8 local_e8;
  undefined6 local_e0;
  undefined2 uStack_da;
  undefined6 uStack_d8;
  undefined1 local_d2;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar35 = 0;
  sch = calloc_or_throw<Search::search>(1);
  psVar19 = calloc_or_throw<Search::search_private>(1);
  sch->priv = psVar19;
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  local_4d0._M_string_length = 0;
  local_4d0.field_2._M_local_buf[0] = '\0';
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  local_458._M_string_length = 0;
  local_458.field_2._M_local_buf[0] = '\0';
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  local_478.field_2._M_allocated_capacity._0_4_ = 0x61746164;
  local_478._M_string_length = 4;
  local_478.field_2._M_local_buf[4] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410._M_string_length = 0;
  local_410.field_2._M_local_buf[0] = '\0';
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  local_518.field_2._M_allocated_capacity._0_5_ = 0x705f78696d;
  local_518.field_2._M_allocated_capacity._5_3_ = 0x5f7265;
  local_518.field_2._8_5_ = 0x6574617473;
  local_518._M_string_length = 0xd;
  local_518.field_2._M_local_buf[0xd] = '\0';
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  local_4f8.field_2._M_allocated_capacity._0_5_ = 0x705f78696d;
  local_4f8.field_2._M_allocated_capacity._5_3_ = 0x5f7265;
  local_4f8.field_2._8_5_ = 0x6574617473;
  local_4f8._M_string_length = 0xd;
  local_4f8.field_2._M_local_buf[0xd] = '\0';
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430._M_string_length = 0;
  local_430.field_2._M_local_buf[0] = '\0';
  psVar19->A = 1;
  local_e0 = 0x686372616553;
  uStack_da = 0x6f20;
  uStack_d8 = 0x736e6f697470;
  local_e8 = 0xe;
  local_d2 = 0;
  local_558.m_name._M_dataplus._M_p = (pointer)&local_558.m_name.field_2;
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_558,&local_e0);
  local_558.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_520 = all;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  local_110.field_2._M_allocated_capacity._0_4_ = 0x72616573;
  local_110.field_2._M_allocated_capacity._4_2_ = 0x6863;
  local_110._M_string_length = 6;
  local_110.field_2._M_local_buf[6] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_6f0,&local_110,&psVar19->A);
  local_680 = true;
  local_738 = &local_728;
  local_718 = (undefined8 *)0x3f;
  local_738 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  local_728 = local_718;
  builtin_strncpy((char *)((long)local_738 + 0x2f)," id or 0",8);
  builtin_strncpy((char *)((long)local_738 + 0x37)," for LDF",8);
  local_738[4] = (undefined8 *)0x6d756d6978616d3d;
  local_738[5] = (undefined8 *)0x206e6f6974636120;
  local_738[2] = (undefined8 *)0x202c686372616573;
  local_738[3] = (undefined8 *)0x746e656d75677261;
  *local_738 = (undefined8 *)0x7261656c20657355;
  local_738[1] = (undefined8 *)0x206f7420676e696e;
  local_730 = local_718;
  *(char *)((long)local_738 + (long)local_718) = '\0';
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_558,(typed_option<unsigned_long> *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5088;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_130.field_2._M_allocated_capacity._0_7_ = 0x5f686372616573;
  local_130.field_2._7_4_ = 0x6b736174;
  local_130._M_string_length = 0xb;
  local_130.field_2._M_local_buf[0xb] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6f0,&local_130,&local_4d0);
  local_680 = true;
  local_738 = &local_728;
  local_718 = (undefined8 *)0x4b;
  local_6f8 = options;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,"the search task (use \"--search_task list\" to get a list of available tasks)",
         0x4b);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_558,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5018;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  local_150.field_2._M_allocated_capacity._0_7_ = 0x5f686372616573;
  local_150.field_2._M_local_buf[7] = 'm';
  local_150.field_2._8_7_ = 0x6b736174617465;
  local_150._M_string_length = 0xf;
  local_150.field_2._M_local_buf[0xf] = '\0';
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6f0,&local_150,&local_458);
  local_680 = true;
  local_738 = &local_728;
  local_718 = (undefined8 *)0x57;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,
         "the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"
         ,0x57);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_558,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5018;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x14;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)&local_738);
  local_230.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_230._M_dataplus._M_p,"search_interpolation",0x14);
  local_230._M_string_length = (size_type)local_738;
  local_230._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6f0,&local_230,&local_478);
  local_680 = true;
  local_738 = &local_728;
  local_718 = (undefined8 *)0x39;
  local_738 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  local_728 = local_718;
  builtin_strncpy((char *)((long)local_738 + 0x29),"? [*data",8);
  builtin_strncpy((char *)((long)local_738 + 0x31),"|policy]",8);
  local_738[4] = (undefined8 *)0x6570706168206e6f;
  local_738[5] = (undefined8 *)0x7461642a5b203f6e;
  local_738[2] = (undefined8 *)0x746e6920646c756f;
  local_738[3] = (undefined8 *)0x6974616c6f707265;
  *local_738 = (undefined8 *)0x2074616877207461;
  local_738[1] = (undefined8 *)0x6873206c6576656c;
  local_730 = local_718;
  *(char *)((long)local_738 + (long)local_718) = '\0';
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_558,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5018;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  local_170.field_2._M_allocated_capacity._0_6_ = 0x686372616573;
  local_170.field_2._M_allocated_capacity._6_2_ = 0x725f;
  local_170.field_2._8_6_ = 0x74756f6c6c6f;
  local_170._M_string_length = 0xe;
  local_170.field_2._M_local_buf[0xe] = '\0';
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6f0,&local_170,&local_518);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x5b;
  local_568 = &psVar19->A;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,
         "how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"
         ,0x5b);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_558,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5018;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  local_190.field_2._M_allocated_capacity._0_5_ = 0x6372616573;
  local_190.field_2._M_allocated_capacity._5_3_ = 0x725f68;
  local_190.field_2._8_5_ = 0x6e696c6c6f;
  local_190._M_string_length = 0xd;
  local_190.field_2._M_local_buf[0xd] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6f0,&local_190,&local_4f8);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x56;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,
         "how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]",
         0x56);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_558,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5018;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x18;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&local_738);
  local_250.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_250._M_dataplus._M_p,"search_passes_per_policy",0x18);
  local_250._M_string_length = (size_type)local_738;
  local_250._M_dataplus._M_p[(long)local_738] = '\0';
  local_4d8 = &psVar19->passes_per_policy;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_6f0,&local_250,local_4d8);
  ptVar21 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)local_6f0,1);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x48;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,"number of passes per policy (only valid for search_interpolation=policy)",0x48);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar21->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_558,ptVar21);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5088;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  local_1b0.field_2._M_allocated_capacity._0_7_ = 0x5f686372616573;
  local_1b0.field_2._7_4_ = 0x61746562;
  local_1b0._M_string_length = 0xb;
  local_1b0.field_2._M_local_buf[0xb] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_6f0,&local_1b0,&psVar19->beta);
  ptVar22 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_6f0,0.5);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x4c;
  local_480 = &psVar19->beta;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,"interpolation rate for policies (only valid for search_interpolation=policy)",
         0x4c);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar22->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_558,ptVar22);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d50c0;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  local_1d0.field_2._M_allocated_capacity = 0x615f686372616573;
  local_1d0.field_2._8_4_ = 0x6168706c;
  local_1d0._M_string_length = 0xc;
  local_1d0.field_2._M_local_buf[0xc] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_6f0,&local_1d0,&psVar19->alpha);
  ptVar22 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_6f0,1e-10);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x48;
  local_488 = &psVar19->alpha;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,"annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)",0x48);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar22->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_558,ptVar22);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d50c0;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x18;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  local_270._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_738);
  local_270.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_270._M_dataplus._M_p,"search_total_nb_policies",0x18);
  local_270._M_string_length = (size_type)local_738;
  local_270._M_dataplus._M_p[(long)local_738] = '\0';
  local_560 = &psVar19->total_number_of_policies;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_6f0,&local_270,local_560);
  local_738 = &local_728;
  local_718 = (undefined8 *)0xaf;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,
         "if we are going to train the policies through multiple separate calls to vw, we need to specify this parameter and tell vw how many policies are eventually going to be trained"
         ,0xaf);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_558,(typed_option<unsigned_int> *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d50f8;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x1a;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_290,(ulong)&local_738);
  local_290.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_290._M_dataplus._M_p,"search_trained_nb_policies",0x1a);
  local_290._M_string_length = (size_type)local_738;
  local_290._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_6f0,&local_290,&local_434);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x28;
  local_738 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  local_728 = local_718;
  local_738[2] = (undefined8 *)0x6f702064656e6961;
  local_738[3] = (undefined8 *)0x692073656963696c;
  *local_738 = (undefined8 *)0x626d756e20656874;
  local_738[1] = (undefined8 *)0x727420666f207265;
  local_738[4] = (undefined8 *)0x656c69662061206e;
  local_730 = local_718;
  *(char *)((long)local_738 + (long)local_718) = '\0';
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_558,(typed_option<unsigned_int> *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d50f8;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x1a;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  local_2b0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b0,(ulong)&local_738);
  local_2b0.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_2b0._M_dataplus._M_p,"search_allowed_transitions",0x1a);
  local_2b0._M_string_length = (size_type)local_738;
  local_2b0._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6f0,&local_2b0,&local_430);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x43;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,"read file of allowed transitions [def: all transitions are allowed]",0x43);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_558,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5018;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x15;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  local_2d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2d0,(ulong)&local_738);
  local_2d0.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_2d0._M_dataplus._M_p,"search_subsample_time",0x15);
  local_2d0._M_string_length = (size_type)local_738;
  local_2d0._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_6f0,&local_2d0,&psVar19->subsample_timesteps);
  local_738 = &local_728;
  local_718 = (undefined8 *)0xab;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,
         "instead of training at all timesteps, use a subset. if value in (0,1), train on a random v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"
         ,0xab);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (&local_558,(typed_option<float> *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d50c0;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x18;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f0,(ulong)&local_738);
  local_2f0.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_2f0._M_dataplus._M_p,"search_neighbor_features",0x18);
  local_2f0._M_string_length = (size_type)local_738;
  local_2f0._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6f0,&local_2f0,&local_410);
  local_680 = true;
  local_738 = &local_728;
  local_718 = (undefined8 *)0xb1;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,
         "copy features from neighboring lines. argument looks like: \'-1:a,+2\' meaning copy previous line namespace a and next next line from namespace _unnamed_, where \',\' separates them"
         ,0xb1);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_558,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5018;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x18;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_738);
  local_310.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_310._M_dataplus._M_p,"search_rollout_num_steps",0x18);
  local_310._M_string_length = (size_type)local_738;
  local_310._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_6f0,&local_310,&psVar19->rollout_num_steps);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x75;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,
         "how many calls of \"loss\" before we stop really predicting on rollouts and switch to oracle (default means \"infinite\")"
         ,0x75);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_558,(typed_option<unsigned_long> *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5088;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x15;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_738);
  local_330.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_330._M_dataplus._M_p,"search_history_length",0x15);
  local_330._M_string_length = (size_type)local_738;
  local_330._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_6f0,&local_330,&psVar19->history_length);
  local_680 = true;
  ptVar21 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)local_6f0,1);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x53;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,
         "some tasks allow you to specify how much history their depend on; specify that here",0x53)
  ;
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar21->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_558,ptVar21);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5088;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x11;
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_350,(ulong)&local_738);
  local_350.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_350._M_dataplus._M_p,"search_no_caching",0x11);
  local_350._M_string_length = (size_type)local_738;
  local_350._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_6f0,&local_350,&psVar19->no_caching);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x56;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,
         "turn off the built-in caching ability (makes things slower, but technically more safe)",
         0x56);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_558,(typed_option<bool> *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  local_1f0.field_2._M_allocated_capacity = 0x785f686372616573;
  local_1f0.field_2._8_2_ = 0x76;
  local_1f0._M_string_length = 9;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_6f0,&local_1f0,&psVar19->xv);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x3c;
  local_738 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  local_728 = local_718;
  builtin_strncpy((char *)((long)local_738 + 0x2c),"diction/",8);
  builtin_strncpy((char *)((long)local_738 + 0x34),"learning",8);
  local_738[4] = (undefined8 *)0x676e6974616e7265;
  local_738[5] = (undefined8 *)0x7463696465727020;
  local_738[2] = (undefined8 *)0x63696c6f70206574;
  local_738[3] = (undefined8 *)0x746c61202c736569;
  *local_738 = (undefined8 *)0x7774206e69617274;
  local_738[1] = (undefined8 *)0x617261706573206f;
  local_730 = local_718;
  *(char *)((long)local_738 + (long)local_718) = '\0';
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_558,(typed_option<bool> *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x15;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  local_370._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_370,(ulong)&local_738);
  local_370.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_370._M_dataplus._M_p,"search_perturb_oracle",0x15);
  local_370._M_string_length = (size_type)local_738;
  local_370._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_6f0,&local_370,&psVar19->perturb_oracle);
  ptVar22 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_6f0,0.0);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x32;
  local_738 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  local_728 = local_718;
  local_738[4] = (undefined8 *)0x7020736968742068;
  local_738[5] = (undefined8 *)0x696c696261626f72;
  local_738[2] = (undefined8 *)0x6f72206e6f20656c;
  local_738[3] = (undefined8 *)0x746977206e696c6c;
  *local_738 = (undefined8 *)0x2062727574726570;
  local_738[1] = (undefined8 *)0x6361726f20656874;
  *(undefined2 *)(local_738 + 6) = 0x7974;
  local_730 = local_718;
  *(char *)((long)local_738 + (long)local_718) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar22->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_558,ptVar22);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d50c0;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x16;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_390,(ulong)&local_738);
  local_390.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_390._M_dataplus._M_p,"search_linear_ordering",0x16);
  local_390._M_string_length = (size_type)local_738;
  local_390._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_6f0,&local_390,&psVar19->linear_ordering);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x47;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,"insist on generating examples in linear order (def: hoopla permutation)",0x47);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_558,(typed_option<bool> *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x14;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3b0,(ulong)&local_738);
  poVar2 = local_6f8;
  local_3b0.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_3b0._M_dataplus._M_p,"search_active_verify",0x14);
  local_3b0._M_string_length = (size_type)local_738;
  local_3b0._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_6f0,&local_3b0,&psVar19->active_csoaa_verify);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x69;
  local_490 = &psVar19->active_csoaa_verify;
  ppuVar20 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  puVar12 = local_718;
  local_728 = local_718;
  local_738 = ppuVar20;
  memcpy(ppuVar20,
         "verify that active learning is doing the right thing (arg = multiplier, should be = cost_range * range_c)"
         ,0x69);
  local_730 = puVar12;
  *(undefined1 *)((long)ppuVar20 + (long)puVar12) = 0;
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (&local_558,(typed_option<float> *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d50c0;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  local_738 = (undefined8 **)0x18;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d0,(ulong)&local_738);
  local_3d0.field_2._M_allocated_capacity = (size_type)local_738;
  builtin_strncpy(local_3d0._M_dataplus._M_p,"search_save_every_k_runs",0x18);
  local_3d0._M_string_length = (size_type)local_738;
  local_3d0._M_dataplus._M_p[(long)local_738] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_6f0,&local_3d0,&psVar19->save_every_k_runs);
  local_738 = &local_728;
  local_718 = (undefined8 *)0x17;
  local_738 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_738,(ulong)&local_718);
  local_728 = local_718;
  *local_738 = (undefined8 *)0x646f6d2065766173;
  local_738[1] = (undefined8 *)0x7972657665206c65;
  builtin_strncpy((char *)((long)local_738 + 0xf),"y k runs",8);
  local_730 = local_718;
  *(char *)((long)local_738 + (long)local_718) = '\0';
  std::__cxx11::string::_M_assign(local_6c0);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_558,(typed_option<unsigned_long> *)local_6f0);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  local_6f0._0_8_ = &PTR__typed_option_002d5088;
  if (local_658._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658._M_pi);
  }
  if (local_668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  (**poVar2->_vptr_options_i)(poVar2,&local_558);
  pvVar13 = local_520;
  local_6e0._0_2_ = 0x6573;
  local_6e0[2] = 'a';
  local_6e0[3] = 'r';
  local_6e0[4] = 'c';
  local_6e0[5] = 'h';
  local_6e0[6] = '_';
  local_6e0[7] = 't';
  local_6e0._8_2_ = 0x7361;
  local_6e0[10] = 'k';
  local_6f0._8_8_ = (char *)0xb;
  local_6e0[0xb] = '\0';
  local_6f0._0_8_ = local_6e0;
  iVar16 = (*poVar2->_vptr_options_i[1])(poVar2,local_6f0);
  if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
    operator_delete((void *)local_6f0._0_8_);
  }
  if ((char)iVar16 == '\0') {
    plVar28 = (learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
    goto LAB_0025c011;
  }
  search_initialize(pvVar13,sch);
  parse_neighbor_features(&local_410,sch);
  iVar16 = std::__cxx11::string::compare((char *)&local_478);
  if (iVar16 == 0) {
    psVar19->allow_current_policy = true;
    psVar19->adaptive_beta = true;
    psVar19->passes_per_policy = pvVar13->numpasses;
    if (1 < psVar19->current_policy) {
      psVar19->current_policy = 1;
    }
  }
  else {
    iVar16 = std::__cxx11::string::compare((char *)&local_478);
    if (iVar16 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_6f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_6e0,"error: --search_interpolation must be \'data\' or \'policy\'"
                 ,0x38);
      pvVar23 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar23,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0xac5,&local_50);
      __cxa_throw(pvVar23,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  iVar16 = std::__cxx11::string::compare((char *)&local_518);
  if ((iVar16 == 0) || (iVar16 = std::__cxx11::string::compare((char *)&local_518), iVar16 == 0)) {
    psVar19->rollout_method = POLICY;
  }
  else {
    iVar16 = std::__cxx11::string::compare((char *)&local_518);
    if ((iVar16 == 0) || (iVar16 = std::__cxx11::string::compare((char *)&local_518), iVar16 == 0))
    {
      psVar19->rollout_method = ORACLE;
    }
    else {
      iVar16 = std::__cxx11::string::compare((char *)&local_518);
      if (iVar16 == 0) {
        psVar19->rollout_method = MIX_PER_STATE;
      }
      else {
        iVar16 = std::__cxx11::string::compare((char *)&local_518);
        if ((iVar16 == 0) ||
           (iVar16 = std::__cxx11::string::compare((char *)&local_518), iVar16 == 0)) {
          psVar19->rollout_method = MIX_PER_ROLL;
        }
        else {
          iVar16 = std::__cxx11::string::compare((char *)&local_518);
          if (iVar16 != 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_6f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6e0,
                       "error: --search_rollout must be \'learn\', \'ref\', \'mix\', \'mix_per_state\' or \'none\'"
                       ,0x50);
            pvVar23 = (vw_exception *)__cxa_allocate_exception(0x38);
            std::__cxx11::stringbuf::str();
            VW::vw_exception::vw_exception
                      (pvVar23,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                       ,0xad5,&local_70);
            __cxa_throw(pvVar23,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          psVar19->rollout_method = NO_ROLLOUT;
          psVar19->no_caching = true;
        }
      }
    }
  }
  iVar16 = std::__cxx11::string::compare((char *)&local_4f8);
  RVar32 = POLICY;
  if ((iVar16 != 0) && (iVar16 = std::__cxx11::string::compare((char *)&local_4f8), iVar16 != 0)) {
    iVar16 = std::__cxx11::string::compare((char *)&local_4f8);
    RVar32 = ORACLE;
    if ((iVar16 != 0) && (iVar16 = std::__cxx11::string::compare((char *)&local_4f8), iVar16 != 0))
    {
      iVar16 = std::__cxx11::string::compare((char *)&local_4f8);
      if (iVar16 == 0) {
        RVar32 = MIX_PER_STATE;
      }
      else {
        iVar16 = std::__cxx11::string::compare((char *)&local_4f8);
        RVar32 = MIX_PER_ROLL;
        if ((iVar16 != 0) &&
           (iVar16 = std::__cxx11::string::compare((char *)&local_4f8), iVar16 != 0)) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_6f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6e0,
                     "error: --search_rollin must be \'learn\', \'ref\', \'mix\' or \'mix_per_state\'"
                     ,0x47);
          pvVar23 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar23,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0xae0,&local_90);
          __cxa_throw(pvVar23,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
    }
  }
  psVar19->rollin_method = RVar32;
  ppVar24 = calloc_or_throw<polylabel>(1);
  psVar19->allowed_actions_cache = ppVar24;
  local_6e0._0_2_ = 0x6263;
  local_6f0._8_8_ = (pointer)0x2;
  local_6e0[2] = '\0';
  local_6f0._0_8_ = local_6e0;
  iVar16 = (*poVar2->_vptr_options_i[1])(poVar2);
  if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
    operator_delete((void *)local_6f0._0_8_);
  }
  psVar19->cb_learner = SUB41(iVar16,0);
  if (SUB41(iVar16,0) == false) {
    ppuVar25 = &COST_SENSITIVE::cs_label;
  }
  else {
    ppuVar25 = &CB::cb_label;
  }
  (*(code *)*ppuVar25)(psVar19->allowed_actions_cache);
  (psVar19->learn_losses).cs.costs.end_array = (wclass *)0x0;
  (psVar19->learn_losses).cs.costs.erase_count = 0;
  (psVar19->learn_losses).cs.costs._begin = (wclass *)0x0;
  (psVar19->learn_losses).cs.costs._end = (wclass *)0x0;
  (psVar19->gte_label).cs.costs._begin = (wclass *)0x0;
  (psVar19->gte_label).cs.costs._end = (wclass *)0x0;
  (psVar19->gte_label).cs.costs.end_array = (wclass *)0x0;
  (psVar19->gte_label).cs.costs.erase_count = 0;
  ensure_param(local_480,0.0,1.0,0.5,"warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(local_488,0.0,1.0,1e-10,"warning: search_alpha must be in (0,1); resetting to 1e-10")
  ;
  psVar19->num_calls_to_run = 0;
  uVar1 = psVar19->current_policy;
  uVar17 = uVar1;
  if (pvVar13->training == true) {
    fVar36 = ceilf((float)pvVar13->numpasses / (float)*local_4d8);
    uVar17 = (int)fVar36 + uVar1;
  }
  if ((*local_560 < uVar17) && (*local_560 = uVar17, uVar1 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "warning: you\'re attempting to train more classifiers than was allocated initially. Likely to cause bad performance."
               ,0x73);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  if ((pvVar13->training == false) && (psVar19->current_policy != 0)) {
    psVar19->current_policy = psVar19->current_policy - 1;
  }
  poVar2 = pvVar13->options;
  local_738 = (undefined8 **)0x1a;
  local_6f0._0_8_ = local_6e0;
  local_6f0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6f0,(ulong)&local_738);
  local_6e0._0_2_ = SUB82(local_738,0);
  local_6e0[2] = (undefined1)((ulong)local_738 >> 0x10);
  local_6e0[3] = (undefined1)((ulong)local_738 >> 0x18);
  local_6e0[4] = (undefined1)((ulong)local_738 >> 0x20);
  local_6e0[5] = (undefined1)((ulong)local_738 >> 0x28);
  local_6e0[6] = (undefined1)((ulong)local_738 >> 0x30);
  local_6e0[7] = (undefined1)((ulong)local_738 >> 0x38);
  builtin_strncpy((char *)(local_6f0._0_8_ + 10),"ined_nb_",8);
  builtin_strncpy((char *)(local_6f0._0_8_ + 0x12),"policies",8);
  *(undefined8 *)local_6f0._0_8_ = 0x745f686372616573;
  *(undefined8 *)(local_6f0._0_8_ + 8) = 0x6e5f64656e696172;
  local_6f0._8_8_ = local_738;
  *(char *)(local_6f0._0_8_ + (long)local_738) = '\0';
  uVar1 = psVar19->current_policy;
  cVar15 = '\x01';
  if (9 < uVar1) {
    uVar17 = uVar1;
    cVar14 = '\x04';
    do {
      cVar15 = cVar14;
      if (uVar17 < 100) {
        cVar15 = cVar15 + -2;
        goto LAB_0025b6d9;
      }
      if (uVar17 < 1000) {
        cVar15 = cVar15 + -1;
        goto LAB_0025b6d9;
      }
      if (uVar17 < 10000) goto LAB_0025b6d9;
      bVar9 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar14 = cVar15 + '\x04';
    } while (bVar9);
    cVar15 = cVar15 + '\x01';
  }
LAB_0025b6d9:
  local_738 = &local_728;
  std::__cxx11::string::_M_construct((ulong)&local_738,cVar15);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_738,(uint)local_730,uVar1);
  (*poVar2->_vptr_options_i[6])(poVar2,local_6f0,&local_738);
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
    operator_delete((void *)local_6f0._0_8_);
  }
  poVar2 = pvVar13->options;
  local_738 = (undefined8 **)0x1a;
  local_6f0._0_8_ = local_6e0;
  local_6f0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6f0,(ulong)&local_738);
  local_6e0._0_2_ = SUB82(local_738,0);
  local_6e0[2] = (undefined1)((ulong)local_738 >> 0x10);
  local_6e0[3] = (undefined1)((ulong)local_738 >> 0x18);
  local_6e0[4] = (undefined1)((ulong)local_738 >> 0x20);
  local_6e0[5] = (undefined1)((ulong)local_738 >> 0x28);
  local_6e0[6] = (undefined1)((ulong)local_738 >> 0x30);
  local_6e0[7] = (undefined1)((ulong)local_738 >> 0x38);
  builtin_strncpy((char *)(local_6f0._0_8_ + 10),"ined_nb_",8);
  builtin_strncpy((char *)(local_6f0._0_8_ + 0x12),"policies",8);
  *(undefined8 *)local_6f0._0_8_ = 0x745f686372616573;
  *(undefined8 *)(local_6f0._0_8_ + 8) = 0x6e5f64656e696172;
  local_6f0._8_8_ = local_738;
  *(char *)(local_6f0._0_8_ + (long)local_738) = '\0';
  ptVar26 = VW::config::options_i::get_typed_option<unsigned_int>(poVar2,(string *)local_6f0);
  VW::config::typed_option<unsigned_int>::value(ptVar26,psVar19->current_policy);
  if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
    operator_delete((void *)local_6f0._0_8_);
  }
  poVar2 = pvVar13->options;
  local_738 = (undefined8 **)0x18;
  local_6f0._0_8_ = local_6e0;
  local_6f0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6f0,(ulong)&local_738);
  local_6e0._0_2_ = SUB82(local_738,0);
  local_6e0[2] = (undefined1)((ulong)local_738 >> 0x10);
  local_6e0[3] = (undefined1)((ulong)local_738 >> 0x18);
  local_6e0[4] = (undefined1)((ulong)local_738 >> 0x20);
  local_6e0[5] = (undefined1)((ulong)local_738 >> 0x28);
  local_6e0[6] = (undefined1)((ulong)local_738 >> 0x30);
  local_6e0[7] = (undefined1)((ulong)local_738 >> 0x38);
  *(undefined8 *)local_6f0._0_8_ = 0x745f686372616573;
  *(undefined8 *)(local_6f0._0_8_ + 8) = 0x5f626e5f6c61746f;
  *(_func_int **)(local_6f0._0_8_ + 0x10) = (_func_int *)0x73656963696c6f70;
  local_6f0._8_8_ = local_738;
  *(char *)(local_6f0._0_8_ + (long)local_738) = '\0';
  uVar1 = *local_560;
  cVar15 = '\x01';
  if (9 < uVar1) {
    uVar17 = uVar1;
    cVar14 = '\x04';
    do {
      cVar15 = cVar14;
      if (uVar17 < 100) {
        cVar15 = cVar15 + -2;
        goto LAB_0025b869;
      }
      if (uVar17 < 1000) {
        cVar15 = cVar15 + -1;
        goto LAB_0025b869;
      }
      if (uVar17 < 10000) goto LAB_0025b869;
      bVar9 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar14 = cVar15 + '\x04';
    } while (bVar9);
    cVar15 = cVar15 + '\x01';
  }
LAB_0025b869:
  local_738 = &local_728;
  std::__cxx11::string::_M_construct((ulong)&local_738,cVar15);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_738,(uint)local_730,uVar1);
  (*poVar2->_vptr_options_i[6])(poVar2,local_6f0,&local_738);
  poVar2 = local_6f8;
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
    operator_delete((void *)local_6f0._0_8_);
  }
  this = pvVar13->options;
  local_6f0._0_8_ = local_6e0;
  local_738 = (undefined8 **)0x18;
  local_6f0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6f0,(ulong)&local_738);
  local_6e0._0_2_ = SUB82(local_738,0);
  local_6e0[2] = (undefined1)((ulong)local_738 >> 0x10);
  local_6e0[3] = (undefined1)((ulong)local_738 >> 0x18);
  local_6e0[4] = (undefined1)((ulong)local_738 >> 0x20);
  local_6e0[5] = (undefined1)((ulong)local_738 >> 0x28);
  local_6e0[6] = (undefined1)((ulong)local_738 >> 0x30);
  local_6e0[7] = (undefined1)((ulong)local_738 >> 0x38);
  *(undefined8 *)local_6f0._0_8_ = 0x745f686372616573;
  *(undefined8 *)(local_6f0._0_8_ + 8) = 0x5f626e5f6c61746f;
  *(_func_int **)(local_6f0._0_8_ + 0x10) = (_func_int *)0x73656963696c6f70;
  local_6f0._8_8_ = local_738;
  *(char *)(local_6f0._0_8_ + (long)local_738) = '\0';
  ptVar26 = VW::config::options_i::get_typed_option<unsigned_int>(this,(string *)local_6f0);
  VW::config::typed_option<unsigned_int>::value(ptVar26,*local_560);
  if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
    operator_delete((void *)local_6f0._0_8_);
  }
  iVar16 = std::__cxx11::string::compare((char *)&local_4d0);
  if (iVar16 == 0) {
    poVar29 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar29,"available search tasks:",0x17);
    std::endl<char,std::char_traits<char>>(poVar29);
    if (all_tasks != (undefined *)0x0) {
      ppuVar25 = &PTR_task_002d9b68;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
        poVar29 = std::operator<<((ostream *)&std::cerr,*(char **)ppuVar25[-1]);
        std::endl<char,std::char_traits<char>>(poVar29);
        puVar3 = *ppuVar25;
        ppuVar25 = ppuVar25 + 1;
      } while (puVar3 != (undefined *)0x0);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0025c1f7:
    exit(0);
  }
  iVar16 = std::__cxx11::string::compare((char *)&local_458);
  if (iVar16 == 0) {
    poVar29 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar29,"available search metatasks:",0x1b);
    std::endl<char,std::char_traits<char>>(poVar29);
    if (all_metatasks != (undefined *)0x0) {
      ppuVar25 = &PTR_metatask_002d9bc8;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
        poVar29 = std::operator<<((ostream *)&std::cerr,*(char **)ppuVar25[-1]);
        std::endl<char,std::char_traits<char>>(poVar29);
        puVar3 = *ppuVar25;
        ppuVar25 = ppuVar25 + 1;
      } while (puVar3 != (undefined *)0x0);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    goto LAB_0025c1f7;
  }
  if (all_tasks != (undefined *)0x0) {
    ppuVar25 = &PTR_task_002d9b68;
    do {
      iVar16 = std::__cxx11::string::compare((char *)&local_4d0);
      if (iVar16 == 0) {
        psVar4 = (search_task *)ppuVar25[-1];
        psVar19->task = psVar4;
        sch->task_name = psVar4->task_name;
        break;
      }
      puVar3 = *ppuVar25;
      ppuVar25 = ppuVar25 + 1;
    } while (puVar3 != (undefined *)0x0);
  }
  if (psVar19->task == (search_task *)0x0) {
    local_6e0._0_2_ = 0x6568;
    local_6e0[2] = 'l';
    local_6e0[3] = 'p';
    local_6f0._8_8_ = (undefined8 **)0x4;
    local_6e0[4] = '\0';
    local_6f0._0_8_ = local_6e0;
    iVar16 = (*poVar2->_vptr_options_i[1])(poVar2);
    if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
      operator_delete((void *)local_6f0._0_8_);
    }
    if ((char)iVar16 == '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_6f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_6e0,"fail: unknown task for --search_task \'",0x26);
      poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_6e0,local_4d0._M_dataplus._M_p,
                           local_4d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar29,"\'; use --search_task list to get a list",0x27);
      pvVar23 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar23,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0xb35,&local_b0);
      __cxa_throw(pvVar23,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  psVar19->metatask = (search_metatask *)0x0;
  if (all_metatasks != (undefined *)0x0) {
    ppuVar25 = &PTR_metatask_002d9bc8;
    do {
      iVar16 = std::__cxx11::string::compare((char *)&local_458);
      if (iVar16 == 0) {
        psVar5 = (search_metatask *)ppuVar25[-1];
        psVar19->metatask = psVar5;
        sch->metatask_name = psVar5->metatask_name;
        break;
      }
      puVar3 = *ppuVar25;
      ppuVar25 = ppuVar25 + 1;
    } while (puVar3 != (undefined *)0x0);
  }
  local_520->p->emptylines_separate_examples = true;
  local_6f0._0_8_ = local_6e0;
  local_6e0._0_2_ = 0x7363;
  local_6e0[2] = 'o';
  local_6e0[3] = 'a';
  local_6e0[4] = 'a';
  local_6e0[5] = '\0';
  local_6f0._8_8_ = (pointer)0x5;
  iVar16 = (*poVar2->_vptr_options_i[1])(poVar2);
  if ((char)iVar16 == '\0') {
    local_738 = &local_728;
    local_728 = (undefined8 *)0x76697463615f7363;
    local_720 = 0x65;
    local_730 = (undefined8 *)0x9;
    iVar18 = (*poVar2->_vptr_options_i[1])(poVar2);
    if ((char)iVar18 != '\0') goto LAB_0025bb03;
    local_718 = &local_708;
    local_708 = 0x646c5f61616f7363;
    local_700 = 0x66;
    local_710 = 9;
    iVar18 = (*local_6f8->_vptr_options_i[1])(local_6f8,&local_718);
    if ((char)iVar18 != '\0') {
      bVar9 = true;
      goto LAB_0025bb05;
    }
    local_3f0 = &local_3e0;
    local_3e0 = 0x5f706177;
    uStack_3dc = 0x66646c;
    local_3e8 = 7;
    local_3d9 = 0;
    iVar18 = (*local_6f8->_vptr_options_i[1])(local_6f8,&local_3f0);
    if ((char)iVar18 != '\0') {
      bVar9 = true;
      bVar11 = true;
      goto LAB_0025bb0a;
    }
    local_210 = &local_200;
    local_200 = 0x6263;
    local_208 = 2;
    local_1fe = 0;
    iVar18 = (*local_6f8->_vptr_options_i[1])(local_6f8,&local_210);
    bVar34 = (byte)iVar18 ^ 1;
    bVar9 = true;
    bVar11 = true;
    bVar10 = true;
  }
  else {
LAB_0025bb03:
    bVar9 = false;
LAB_0025bb05:
    bVar11 = false;
LAB_0025bb0a:
    bVar10 = false;
    bVar34 = 0;
  }
  if ((bVar10) && (local_210 != &local_200)) {
    operator_delete(local_210);
  }
  pvVar13 = local_520;
  if ((bVar11) && (local_3f0 != &local_3e0)) {
    operator_delete(local_3f0);
  }
  poVar2 = local_6f8;
  if ((bVar9) && (local_718 != &local_708)) {
    operator_delete(local_718);
  }
  if (((char)iVar16 == '\0') && (local_738 != &local_728)) {
    operator_delete(local_738);
  }
  if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
    operator_delete((void *)local_6f0._0_8_);
  }
  local_6f0._0_8_ = local_6e0;
  if (bVar34 != 0) {
    local_6e0._0_2_ = 0x7363;
    local_6e0[2] = 'o';
    local_6e0[3] = 'a';
    local_6e0[4] = 'a';
    local_6e0[5] = '\0';
    local_6f0._8_8_ = (pointer)0x5;
    __val = *local_568;
    cVar15 = '\x01';
    if (9 < __val) {
      uVar30 = __val;
      cVar14 = '\x04';
      do {
        cVar15 = cVar14;
        if (uVar30 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0025bcc4;
        }
        if (uVar30 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0025bcc4;
        }
        if (uVar30 < 10000) goto LAB_0025bcc4;
        bVar9 = 99999 < uVar30;
        uVar30 = uVar30 / 10000;
        cVar14 = cVar15 + '\x04';
      } while (bVar9);
      cVar15 = cVar15 + '\x01';
    }
LAB_0025bcc4:
    local_4b0 = local_4a0;
    std::__cxx11::string::_M_construct((ulong)&local_4b0,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_4b0,local_4a8,__val);
    (*poVar2->_vptr_options_i[5])(poVar2,local_6f0,&local_4b0);
    if (local_4b0 != local_4a0) {
      operator_delete(local_4b0);
    }
    if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
      operator_delete((void *)local_6f0._0_8_);
    }
  }
  local_6e0._0_2_ = 0x7363;
  local_6e0[2] = '_';
  local_6e0[3] = 'a';
  local_6e0[4] = 'c';
  local_6e0[5] = 't';
  local_6e0[6] = 'i';
  local_6e0[7] = 'v';
  local_6e0._8_2_ = 0x65;
  local_6f0._8_8_ = (pointer)0x9;
  local_6f0._0_8_ = local_6e0;
  iVar16 = (*poVar2->_vptr_options_i[1])(poVar2);
  psVar19->active_csoaa = SUB41(iVar16,0);
  if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
    operator_delete((void *)local_6f0._0_8_);
  }
  *local_490 = -1.0;
  local_4b0 = (pointer)0x14;
  local_6f0._0_8_ = local_6e0;
  local_6f0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6f0,(ulong)&local_4b0);
  local_6e0._0_2_ = SUB82(local_4b0,0);
  local_6e0[2] = (undefined1)((ulong)local_4b0 >> 0x10);
  local_6e0[3] = (undefined1)((ulong)local_4b0 >> 0x18);
  local_6e0[4] = (undefined1)((ulong)local_4b0 >> 0x20);
  local_6e0[5] = (undefined1)((ulong)local_4b0 >> 0x28);
  local_6e0[6] = (undefined1)((ulong)local_4b0 >> 0x30);
  local_6e0[7] = (undefined1)((ulong)local_4b0 >> 0x38);
  *(undefined4 *)local_6f0._0_8_ = 0x72616573;
  builtin_strncpy((char *)(local_6f0._0_8_ + 4),"ch_a",4);
  *(undefined4 *)(local_6f0._0_8_ + 8) = 0x76697463;
  builtin_strncpy((char *)(local_6f0._0_8_ + 0xc),"e_ve",4);
  *(undefined4 *)(local_6f0._0_8_ + 0x10) = 0x79666972;
  local_6f0._8_8_ = local_4b0;
  *(char *)(local_6f0._0_8_ + (long)local_4b0) = '\0';
  iVar16 = (*poVar2->_vptr_options_i[1])(poVar2);
  if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
    operator_delete((void *)local_6f0._0_8_);
  }
  if (((char)iVar16 != '\0') && (psVar19->active_csoaa == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_6f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_6e0,"cannot use --search_active_verify without using --cs_active",
               0x3b);
    pvVar23 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar23,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
               ,0xb4b,&local_d0);
    __cxa_throw(pvVar23,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  base = setup_base(pvVar13->options,pvVar13);
  ppuVar25 = &MULTICLASS::mc_label;
  plVar33 = &pvVar13->p->lp;
  for (lVar31 = 9; lVar31 != 0; lVar31 = lVar31 + -1) {
    plVar33->default_label = (_func_void_void_ptr *)*ppuVar25;
    ppuVar25 = ppuVar25 + (ulong)bVar35 * -2 + 1;
    plVar33 = (label_parser *)((long)plVar33 + (ulong)bVar35 * -0x10 + 8);
  }
  pvVar13->label_type = mc;
  if ((psVar19->task != (search_task *)0x0) &&
     (p_Var6 = psVar19->task->initialize,
     p_Var6 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
    (*p_Var6)(sch,local_568,poVar2);
  }
  if ((psVar19->metatask != (search_metatask *)0x0) &&
     (p_Var6 = psVar19->metatask->initialize,
     p_Var6 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
    (*p_Var6)(sch,local_568,poVar2);
  }
  psVar19->meta_t = 0;
  local_4b0 = (char *)0x1a;
  local_6f0._0_8_ = local_6e0;
  local_6f0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6f0,(ulong)&local_4b0);
  local_6e0._0_2_ = SUB82(local_4b0,0);
  local_6e0[2] = (undefined1)((ulong)local_4b0 >> 0x10);
  local_6e0[3] = (undefined1)((ulong)local_4b0 >> 0x18);
  local_6e0[4] = (undefined1)((ulong)local_4b0 >> 0x20);
  local_6e0[5] = (undefined1)((ulong)local_4b0 >> 0x28);
  local_6e0[6] = (undefined1)((ulong)local_4b0 >> 0x30);
  local_6e0[7] = (undefined1)((ulong)local_4b0 >> 0x38);
  builtin_strncpy((char *)(local_6f0._0_8_ + 10),"owed_tra",8);
  builtin_strncpy((char *)(local_6f0._0_8_ + 0x12),"nsitions",8);
  *(undefined4 *)local_6f0._0_8_ = 0x72616573;
  builtin_strncpy((char *)(local_6f0._0_8_ + 4),"ch_a",4);
  *(undefined4 *)(local_6f0._0_8_ + 8) = 0x776f6c6c;
  builtin_strncpy((char *)(local_6f0._0_8_ + 0xc),"ed_t",4);
  local_6f0._8_8_ = local_4b0;
  *(char *)(local_6f0._0_8_ + (long)local_4b0) = '\0';
  iVar16 = (*poVar2->_vptr_options_i[1])(poVar2);
  if ((undefined1 *)local_6f0._0_8_ != local_6e0) {
    operator_delete((void *)local_6f0._0_8_);
  }
  if ((char)iVar16 != '\0') {
    read_allowed_transitions
              ((v_array<COST_SENSITIVE::label> *)local_6f0,(action)*local_568,
               local_430._M_dataplus._M_p);
  }
  handle_condition_options(pvVar13,&psVar19->acset);
  if (psVar19->allow_current_policy == false) {
    pvVar13->check_holdout_every_n_passes = *local_4d8;
  }
  pvVar13->searchstr = sch;
  cVar27 = clock();
  psVar19->start_clock_time = cVar27;
  if (psVar19->xv == true) {
    psVar19->num_learners = psVar19->num_learners * 3;
  }
  plVar28 = LEARNER::learner<Search::search,std::vector<example*,std::allocator<example*>>>::
            init_learner<LEARNER::learner<char,char>>
                      (sch,base,do_actual_learning<true>,do_actual_learning<false>,
                       (ulong)psVar19->total_number_of_policies * psVar19->num_learners,
                       *(prediction_type_t *)(base + 0xd0));
  uVar7 = *(undefined8 *)(plVar28 + 0x18);
  uVar8 = *(undefined8 *)(plVar28 + 0x20);
  *(undefined8 *)(plVar28 + 0x58) = uVar7;
  *(code **)(plVar28 + 0x68) = finish_multiline_example;
  *(undefined8 *)(plVar28 + 0xa0) = uVar7;
  *(undefined8 *)(plVar28 + 0xa8) = uVar8;
  *(code **)(plVar28 + 0xb0) = end_examples;
  *(undefined8 *)(plVar28 + 0xb8) = uVar7;
  *(undefined8 *)(plVar28 + 0xc0) = uVar8;
  *(code **)(plVar28 + 200) = search_finish;
  *(undefined8 *)(plVar28 + 0x88) = uVar7;
  *(undefined8 *)(plVar28 + 0x90) = uVar8;
  *(code **)(plVar28 + 0x98) = end_pass;
  sch = (search *)0x0;
LAB_0025c011:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_558.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558.m_name._M_dataplus._M_p != &local_558.m_name.field_2) {
    operator_delete(local_558.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  if (sch != (search *)0x0) {
    free(sch->priv);
    free(sch);
  }
  return (base_learner *)plVar28;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  free_ptr<search> sch = scoped_calloc_or_throw<search>();
  search_private& priv = *sch->priv;
  std::string task_string;
  std::string metatask_string;
  std::string interpolation_string = "data";
  std::string neighbor_features_string;
  std::string rollout_string = "mix_per_state";
  std::string rollin_string = "mix_per_state";

  uint32_t search_trained_nb_policies;
  std::string search_allowed_transitions;

  priv.A = 1;
  option_group_definition new_options("Search options");
  new_options.add(
      make_option("search", priv.A).keep().help("Use learning to search, argument=maximum action id or 0 for LDF"));
  new_options.add(make_option("search_task", task_string)
                      .keep()
                      .help("the search task (use \"--search_task list\" to get a list of available tasks)"));
  new_options.add(
      make_option("search_metatask", metatask_string)
          .keep()
          .help("the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"));
  new_options.add(make_option("search_interpolation", interpolation_string)
                      .keep()
                      .help("at what level should interpolation happen? [*data|policy]"));
  new_options.add(
      make_option("search_rollout", rollout_string)
          .help("how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"));
  new_options.add(make_option("search_rollin", rollin_string)
                      .help("how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"));
  new_options.add(make_option("search_passes_per_policy", priv.passes_per_policy)
                      .default_value(1)
                      .help("number of passes per policy (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_beta", priv.beta)
                      .default_value(0.5f)
                      .help("interpolation rate for policies (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_alpha", priv.alpha)
                      .default_value(1e-10f)
                      .help("annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)"));
  new_options.add(make_option("search_total_nb_policies", priv.total_number_of_policies)
                      .help("if we are going to train the policies through multiple separate calls to vw, we need to "
                            "specify this parameter and tell vw how many policies are eventually going to be trained"));
  new_options.add(make_option("search_trained_nb_policies", search_trained_nb_policies)
                      .help("the number of trained policies in a file"));
  new_options.add(make_option("search_allowed_transitions", search_allowed_transitions)
                      .help("read file of allowed transitions [def: all transitions are allowed]"));
  new_options.add(make_option("search_subsample_time", priv.subsample_timesteps)
                      .help("instead of training at all timesteps, use a subset. if value in (0,1), train on a random "
                            "v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"));
  new_options.add(
      make_option("search_neighbor_features", neighbor_features_string)
          .keep()
          .help("copy features from neighboring lines. argument looks like: '-1:a,+2' meaning copy previous line "
                "namespace a and next next line from namespace _unnamed_, where ',' separates them"));
  new_options.add(make_option("search_rollout_num_steps", priv.rollout_num_steps)
                      .help("how many calls of \"loss\" before we stop really predicting on rollouts and switch to "
                            "oracle (default means \"infinite\")"));
  new_options.add(make_option("search_history_length", priv.history_length)
                      .keep()
                      .default_value(1)
                      .help("some tasks allow you to specify how much history their depend on; specify that here"));
  new_options.add(make_option("search_no_caching", priv.no_caching)
                      .help("turn off the built-in caching ability (makes things slower, but technically more safe)"));
  new_options.add(
      make_option("search_xv", priv.xv).help("train two separate policies, alternating prediction/learning"));
  new_options.add(make_option("search_perturb_oracle", priv.perturb_oracle)
                      .default_value(0.f)
                      .help("perturb the oracle on rollin with this probability"));
  new_options.add(make_option("search_linear_ordering", priv.linear_ordering)
                      .help("insist on generating examples in linear order (def: hoopla permutation)"));
  new_options.add(make_option("search_active_verify", priv.active_csoaa_verify)
                      .help("verify that active learning is doing the right thing (arg = multiplier, should be = "
                            "cost_range * range_c)"));
  new_options.add(make_option("search_save_every_k_runs", priv.save_every_k_runs).help("save model every k runs"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("search_task"))
    return nullptr;

  search_initialize(&all, *sch.get());

  parse_neighbor_features(neighbor_features_string, *sch.get());

  if (interpolation_string.compare("data") == 0)  // run as dagger
  {
    priv.adaptive_beta = true;
    priv.allow_current_policy = true;
    priv.passes_per_policy = all.numpasses;
    if (priv.current_policy > 1)
      priv.current_policy = 1;
  }
  else if (interpolation_string.compare("policy") == 0)
    ;
  else
    THROW("error: --search_interpolation must be 'data' or 'policy'");

  if ((rollout_string.compare("policy") == 0) || (rollout_string.compare("learn") == 0))
    priv.rollout_method = POLICY;
  else if ((rollout_string.compare("oracle") == 0) || (rollout_string.compare("ref") == 0))
    priv.rollout_method = ORACLE;
  else if ((rollout_string.compare("mix_per_state") == 0))
    priv.rollout_method = MIX_PER_STATE;
  else if ((rollout_string.compare("mix_per_roll") == 0) || (rollout_string.compare("mix") == 0))
    priv.rollout_method = MIX_PER_ROLL;
  else if ((rollout_string.compare("none") == 0))
  {
    priv.rollout_method = NO_ROLLOUT;
    priv.no_caching = true;
  }
  else
    THROW("error: --search_rollout must be 'learn', 'ref', 'mix', 'mix_per_state' or 'none'");

  if ((rollin_string.compare("policy") == 0) || (rollin_string.compare("learn") == 0))
    priv.rollin_method = POLICY;
  else if ((rollin_string.compare("oracle") == 0) || (rollin_string.compare("ref") == 0))
    priv.rollin_method = ORACLE;
  else if ((rollin_string.compare("mix_per_state") == 0))
    priv.rollin_method = MIX_PER_STATE;
  else if ((rollin_string.compare("mix_per_roll") == 0) || (rollin_string.compare("mix") == 0))
    priv.rollin_method = MIX_PER_ROLL;
  else
    THROW("error: --search_rollin must be 'learn', 'ref', 'mix' or 'mix_per_state'");

  // check if the base learner is contextual bandit, in which case, we dont rollout all actions.
  priv.allowed_actions_cache = &calloc_or_throw<polylabel>();
  if (options.was_supplied("cb"))
  {
    priv.cb_learner = true;
    CB::cb_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cb.costs = v_init<CB::cb_class>();
    priv.gte_label.cb.costs = v_init<CB::cb_class>();
  }
  else
  {
    priv.cb_learner = false;
    CS::cs_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cs.costs = v_init<CS::wclass>();
    priv.gte_label.cs.costs = v_init<CS::wclass>();
  }

  ensure_param(priv.beta, 0.0, 1.0, 0.5, "warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(priv.alpha, 0.0, 1.0, 1e-10f, "warning: search_alpha must be in (0,1); resetting to 1e-10");

  priv.num_calls_to_run = 0;

  // compute total number of policies we will have at end of training
  // we add current_policy for cases where we start from an initial set of policies loaded through -i option
  uint32_t tmp_number_of_policies = priv.current_policy;
  if (all.training)
    tmp_number_of_policies += (int)ceil(((float)all.numpasses) / ((float)priv.passes_per_policy));

  // the user might have specified the number of policies that will eventually be trained through multiple vw calls,
  // so only set total_number_of_policies to computed value if it is larger
  cdbg << "current_policy=" << priv.current_policy << " tmp_number_of_policies=" << tmp_number_of_policies
       << " total_number_of_policies=" << priv.total_number_of_policies << endl;
  if (tmp_number_of_policies > priv.total_number_of_policies)
  {
    priv.total_number_of_policies = tmp_number_of_policies;
    if (priv.current_policy >
        0)  // we loaded a file but total number of policies didn't match what is needed for training
      std::cerr << "warning: you're attempting to train more classifiers than was allocated initially. Likely to cause "
                   "bad performance."
                << endl;
  }

  // current policy currently points to a new policy we would train
  // if we are not training and loaded a bunch of policies for testing, we need to subtract 1 from current policy
  // so that we only use those loaded when testing (as run_prediction is called with allow_current to true)
  if (!all.training && priv.current_policy > 0)
    priv.current_policy--;

  all.options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
  all.options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);

  all.options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
  all.options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);

  cdbg << "search current_policy = " << priv.current_policy
       << " total_number_of_policies = " << priv.total_number_of_policies << endl;

  if (task_string.compare("list") == 0)
  {
    std::cerr << endl << "available search tasks:" << endl;
    for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->task_name << endl;
    std::cerr << endl;
    exit(0);
  }
  if (metatask_string.compare("list") == 0)
  {
    std::cerr << endl << "available search metatasks:" << endl;
    for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->metatask_name << endl;
    std::cerr << endl;
    exit(0);
  }
  for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
    if (task_string.compare((*mytask)->task_name) == 0)
    {
      priv.task = *mytask;
      sch->task_name = (*mytask)->task_name;
      break;
    }
  if (priv.task == nullptr)
  {
    if (!options.was_supplied("help"))
      THROW("fail: unknown task for --search_task '" << task_string << "'; use --search_task list to get a list");
  }
  priv.metatask = nullptr;
  for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
    if (metatask_string.compare((*mytask)->metatask_name) == 0)
    {
      priv.metatask = *mytask;
      sch->metatask_name = (*mytask)->metatask_name;
      break;
    }
  all.p->emptylines_separate_examples = true;

  if (!options.was_supplied("csoaa") && !options.was_supplied("cs_active") && !options.was_supplied("csoaa_ldf") &&
      !options.was_supplied("wap_ldf") && !options.was_supplied("cb"))
  {
    options.insert("csoaa", std::to_string(priv.A));
  }

  priv.active_csoaa = options.was_supplied("cs_active");
  priv.active_csoaa_verify = -1.;
  if (options.was_supplied("search_active_verify"))
    if (!priv.active_csoaa)
      THROW("cannot use --search_active_verify without using --cs_active");

  cdbg << "active_csoaa = " << priv.active_csoaa << ", active_csoaa_verify = " << priv.active_csoaa_verify << endl;

  base_learner* base = setup_base(*all.options, all);

  // default to OAA labels unless the task wants to override this (which they can do in initialize)
  all.p->lp = MC::mc_label;
  all.label_type = label_type::mc;
  if (priv.task && priv.task->initialize)
    priv.task->initialize(*sch.get(), priv.A, options);
  if (priv.metatask && priv.metatask->initialize)
    priv.metatask->initialize(*sch.get(), priv.A, options);
  priv.meta_t = 0;

  if (options.was_supplied("search_allowed_transitions"))
    read_allowed_transitions((action)priv.A, search_allowed_transitions.c_str());

  // set up auto-history (used to only do this if AUTO_CONDITION_FEATURES was on, but that doesn't work for hooktask)
  handle_condition_options(all, priv.acset);

  if (!priv.allow_current_policy)  // if we're not dagger
    all.check_holdout_every_n_passes = priv.passes_per_policy;

  all.searchstr = sch.get();

  priv.start_clock_time = clock();

  if (priv.xv)
    priv.num_learners *= 3;

  cdbg << "num_learners = " << priv.num_learners << endl;

  learner<search, multi_ex>& l = init_learner(sch, make_base(*base), do_actual_learning<true>,
      do_actual_learning<false>, priv.total_number_of_policies * priv.num_learners);
  l.set_finish_example(finish_multiline_example);
  l.set_end_examples(end_examples);
  l.set_finish(search_finish);
  l.set_end_pass(end_pass);
  return make_base(l);
}